

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O1

void compact_with_snapshot_open_multi_kvs_test(void)

{
  fdb_seqnum_t seqnum;
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  fdb_file_handle *fhandle;
  long lVar9;
  size_t unaff_R13;
  ulong uVar10;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db5;
  fdb_kvs_handle *db4;
  fdb_kvs_handle *db3;
  fdb_kvs_handle *db2;
  fdb_kvs_handle *db1;
  cb_args cb_args;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char keybuf [256];
  fdb_file_handle *pfStack_548;
  timeval tStack_540;
  fdb_config fStack_530;
  code *pcStack_438;
  fdb_snapshot_info_t *pfStack_430;
  ulong uStack_428;
  fdb_kvs_handle *pfStack_420;
  fdb_kvs_handle *pfStack_418;
  fdb_kvs_config fStack_410;
  timeval tStack_3f8;
  char *pcStack_3e8;
  char *pcStack_3e0;
  size_t sStack_3d8;
  char *pcStack_3d0;
  char *pcStack_3c8;
  code *pcStack_3c0;
  fdb_file_handle *local_3b0;
  int local_3a4;
  fdb_kvs_handle *local_3a0;
  fdb_kvs_handle *local_398;
  fdb_kvs_handle *local_390;
  fdb_kvs_handle *local_388;
  fdb_kvs_handle *local_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  timeval local_358;
  fdb_kvs_config local_348;
  fdb_config local_330;
  char local_238 [256];
  char local_138 [264];
  
  pcStack_3c0 = (code *)0x113396;
  gettimeofday(&local_358,(__timezone_ptr_t)0x0);
  pcStack_3c0 = (code *)0x11339b;
  memleak_start();
  pcStack_3c0 = (code *)0x1133ab;
  fdb_get_default_config();
  pcStack_3c0 = (code *)0x1133b8;
  fdb_get_default_kvs_config();
  local_330.compaction_cb_ctx = &local_378;
  local_378 = 0;
  uStack_370 = 0;
  local_368 = 0;
  local_330.wal_threshold = 0x400;
  local_330.flags = 1;
  local_330.compaction_cb = compaction_cb_markers;
  local_330.compaction_cb_mask = 0x1b;
  pcStack_3c0 = (code *)0x1133fe;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_3c0 = (code *)0x113415;
  fdb_open(&local_3b0,"./compact_test1",&local_330);
  pcStack_3c0 = (code *)0x11342c;
  fdb_kvs_open(local_3b0,&local_380,"db1",&local_348);
  pcStack_3c0 = (code *)0x113443;
  fdb_kvs_open(local_3b0,&local_388,"db2",&local_348);
  pcStack_3c0 = (code *)0x11345a;
  fdb_kvs_open(local_3b0,&local_390,"db3",&local_348);
  pcStack_3c0 = (code *)0x113471;
  fdb_kvs_open(local_3b0,&local_398,"db4",&local_348);
  pcStack_3c0 = (code *)0x113488;
  fdb_kvs_open(local_3b0,&local_3a0,"db5",&local_348);
  uVar7 = 0;
  do {
    iVar5 = (int)uVar7;
    if (iVar5 == 5) goto LAB_0011360c;
    uVar7 = 0;
    local_3a4 = iVar5;
    do {
      pcStack_3c0 = (code *)0x1134c6;
      sprintf(local_138,"key%04d",uVar7);
      pcStack_3c0 = (code *)0x1134d5;
      sprintf(local_238,"body%04d",uVar7);
      pfVar1 = local_380;
      pcStack_3c0 = (code *)0x1134e2;
      sVar3 = strlen(local_138);
      pcStack_3c0 = (code *)0x1134f0;
      sVar4 = strlen(local_238);
      pcStack_3c0 = (code *)0x113504;
      fdb_set_kv(pfVar1,local_138,sVar3,local_238,sVar4);
      pfVar1 = local_388;
      pcStack_3c0 = (code *)0x113511;
      sVar3 = strlen(local_138);
      pcStack_3c0 = (code *)0x11351c;
      sVar4 = strlen(local_238);
      pcStack_3c0 = (code *)0x113530;
      fdb_set_kv(pfVar1,local_138,sVar3,local_238,sVar4);
      pfVar1 = local_390;
      pcStack_3c0 = (code *)0x11353d;
      sVar3 = strlen(local_138);
      pcStack_3c0 = (code *)0x113548;
      sVar4 = strlen(local_238);
      pcStack_3c0 = (code *)0x11355c;
      fdb_set_kv(pfVar1,local_138,sVar3,local_238,sVar4);
      pfVar1 = local_398;
      pcStack_3c0 = (code *)0x113569;
      sVar3 = strlen(local_138);
      pcStack_3c0 = (code *)0x113574;
      sVar4 = strlen(local_238);
      pcStack_3c0 = (code *)0x113588;
      fdb_set_kv(pfVar1,local_138,sVar3,local_238,sVar4);
      pfVar1 = local_3a0;
      pcStack_3c0 = (code *)0x113595;
      unaff_R13 = strlen(local_138);
      pcStack_3c0 = (code *)0x1135a0;
      sVar3 = strlen(local_238);
      pcStack_3c0 = (code *)0x1135be;
      fdb_set_kv(pfVar1,local_138,unaff_R13,local_238,sVar3);
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
    } while (uVar6 != 1000);
    pcStack_3c0 = (code *)0x1135db;
    fhandle = local_3b0;
    fVar2 = fdb_commit(local_3b0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_3c0 = (code *)0x11366b;
      compact_with_snapshot_open_multi_kvs_test();
      goto LAB_0011366b;
    }
    uVar7 = (ulong)(local_3a4 + 1U);
    local_378 = CONCAT44(local_378._4_4_,(local_3a4 + 1U) * 1000);
    pcStack_3c0 = (code *)0x1135ff;
    fVar2 = fdb_compact(local_3b0,(char *)0x0);
  } while (fVar2 == FDB_RESULT_SUCCESS);
  pcStack_3c0 = (code *)0x11360c;
  compact_with_snapshot_open_multi_kvs_test();
LAB_0011360c:
  pcStack_3c0 = (code *)0x113616;
  fhandle = local_3b0;
  fVar2 = fdb_close(local_3b0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_3c0 = (code *)0x11361f;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcVar8 = "%s PASSED\n";
      if (compact_with_snapshot_open_multi_kvs_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pcStack_3c0 = (code *)0x113654;
      fprintf(_stderr,pcVar8,"compact with snapshot_open multi kvs test");
      return;
    }
  }
  else {
LAB_0011366b:
    pcStack_3c0 = (code *)0x113670;
    compact_with_snapshot_open_multi_kvs_test();
  }
  pcStack_3c0 = compaction_cb_markers;
  compact_with_snapshot_open_multi_kvs_test();
  pcStack_3c8 = "body%04d";
  pcStack_3e8 = "key%04d";
  pcStack_438 = (code *)0x11369a;
  pcStack_3e0 = local_238;
  sStack_3d8 = unaff_R13;
  pcStack_3d0 = local_138;
  pcStack_3c0 = (code *)uVar7;
  gettimeofday(&tStack_3f8,(__timezone_ptr_t)0x0);
  pcStack_438 = (code *)0x1136a4;
  fdb_get_default_kvs_config();
  iVar5 = *(int *)&local_3b0->root;
  pcStack_438 = (code *)0x1136b7;
  fVar2 = fdb_get_all_snap_markers(fhandle,&pfStack_430,&uStack_428);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    if (pfStack_430->num_kvs_markers != 6) {
      pcStack_438 = (code *)0x113799;
      compaction_cb_markers();
    }
    seqnum = pfStack_430->kvs_markers->seqnum;
    if (seqnum == (long)iVar5) {
      if (uStack_428 != 0) {
        uVar7 = 0;
        do {
          if (pfStack_430[uVar7].num_kvs_markers != 0) {
            lVar9 = 0;
            uVar10 = 0;
            do {
              pcVar8 = *(char **)((long)&(pfStack_430[uVar7].kvs_markers)->kv_store_name + lVar9);
              if (pcVar8 != (char *)0x0) {
                pcStack_438 = (code *)0x11372e;
                fdb_kvs_open(fhandle,&pfStack_420,pcVar8,&fStack_410);
                pcStack_438 = (code *)0x113740;
                fVar2 = fdb_snapshot_open(pfStack_420,&pfStack_418,seqnum);
                if (fVar2 == FDB_RESULT_SUCCESS) {
                  pcStack_438 = (code *)0x11374e;
                  fVar2 = fdb_kvs_close(pfStack_418);
                  if (fVar2 != FDB_RESULT_SUCCESS) {
                    pcStack_438 = (code *)0x1137a3;
                    compaction_cb_markers();
                    goto LAB_001137a3;
                  }
                  pcStack_438 = (code *)0x11375c;
                  fVar2 = fdb_kvs_close(pfStack_420);
                  if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00113760;
                }
                else {
LAB_001137a3:
                  pcStack_438 = (code *)0x1137a8;
                  compaction_cb_markers();
                }
                pcStack_438 = (code *)0x1137ad;
                compaction_cb_markers();
                goto LAB_001137ad;
              }
LAB_00113760:
              uVar10 = uVar10 + 1;
              lVar9 = lVar9 + 0x10;
            } while (uVar10 < (ulong)pfStack_430[uVar7].num_kvs_markers);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < uStack_428);
      }
      return;
    }
  }
  else {
LAB_001137ad:
    pcStack_438 = (code *)0x1137b2;
    compaction_cb_markers();
  }
  pcStack_438 = db_compact_during_compaction_cancellation;
  compaction_cb_markers();
  gettimeofday(&tStack_540,(__timezone_ptr_t)0x0);
  fdb_get_default_config();
  fStack_530.compaction_cb = cb_cancel_test;
  fStack_530.compaction_cb_ctx = (void *)0x0;
  fStack_530.compaction_cb_mask = 0x11;
  fVar2 = fdb_open(&pfStack_548,"compact_test",&fStack_530);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xcac);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xcac,"void *db_compact_during_compaction_cancellation(void *)");
  }
  fVar2 = fdb_compact(pfStack_548,(char *)0x0);
  if (((uint)(fVar2 + ~FDB_RESULT_SB_INIT_FAIL) < 0x2e) &&
     ((0x200004000001U >> ((ulong)(uint)(fVar2 + ~FDB_RESULT_SB_INIT_FAIL) & 0x3f) & 1) != 0)) {
    fdb_close(pfStack_548);
    pthread_exit((void *)0x0);
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
          ,0xcb1);
  __assert_fail("status == FDB_RESULT_SUCCESS || status == FDB_RESULT_COMPACTION_CANCELLATION || status == FDB_RESULT_FAIL_BY_ROLLBACK"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xcb1,"void *db_compact_during_compaction_cancellation(void *)");
}

Assistant:

void compact_with_snapshot_open_multi_kvs_test()
{
    TEST_INIT();
    memleak_start();

    int i, j, r;
    int n = 1000;
    char keybuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db1, *db2, *db3, *db4, *db5;
    fdb_status s;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    struct cb_args cb_args;

    memset(&cb_args, 0x0, sizeof(struct cb_args));

    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_cb = compaction_cb_markers;
    fconfig.compaction_cb_ctx = &cb_args;
    fconfig.compaction_cb_mask = FDB_CS_BEGIN |
                                 FDB_CS_MOVE_DOC |
                                 FDB_CS_FLUSH_WAL |
                                 FDB_CS_END;

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    // open two handles for kvs
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open(dbfile, &db1, "db1", &kvs_config);
    fdb_kvs_open(dbfile, &db2, "db2", &kvs_config);
    fdb_kvs_open(dbfile, &db3, "db3", &kvs_config);
    fdb_kvs_open(dbfile, &db4, "db4", &kvs_config);
    fdb_kvs_open(dbfile, &db5, "db5", &kvs_config);
    for (j=0;j<5;++j){
        for (i=0;i<n;++i){
            sprintf(keybuf, "key%04d", i);
            sprintf(bodybuf, "body%04d", i);
            fdb_set_kv(db1, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
            fdb_set_kv(db2, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
            fdb_set_kv(db3, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
            fdb_set_kv(db4, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
            fdb_set_kv(db5, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
        }

        // commit
        s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(s == FDB_RESULT_SUCCESS);

        // compact
        cb_args.n_moved_docs = n*(j+1);
        s = fdb_compact(dbfile, NULL);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_RESULT("compact with snapshot_open multi kvs test");
}